

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

bool __thiscall BloomFilter::exists(BloomFilter *this,uint64_t key)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = (key * -0x783c846eeebdac2b >> 0x21 | key * -0x775ed61580000000) * 0x4cf5ad432745937f ^ 9;
  uVar2 = uVar1 + 9;
  uVar1 = uVar1 + 0x12;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0xae502812aa7333;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0x3b314601e57a13ad;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0xae502812aa7333;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) + uVar1;
  uVar3 = (int)uVar2 + (int)((uVar2 & 0xffffffff) / 0x14000 << 0xe) * -5;
  if ((((*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                   (ulong)(uVar3 >> 3 & 0x3ff8)) >> ((ulong)uVar3 & 0x3f) & 1) != 0) &&
      (uVar3 = (int)(uVar2 >> 0x20) + (int)(uVar2 / 0x1400000000000 << 0xe) * -5,
      (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w + (ulong)(uVar3 >> 3 & 0x3ff8))
       >> ((ulong)uVar3 & 0x3f) & 1) != 0)) &&
     (uVar2 = uVar2 + uVar1, uVar3 = (int)uVar2 + (int)((uVar2 & 0xffffffff) / 0x14000 << 0xe) * -5,
     (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w + (ulong)(uVar3 >> 3 & 0x3ff8))
      >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    uVar3 = (int)(uVar2 >> 0x20) + (int)(uVar2 / 0x1400000000000 << 0xe) * -5;
    return (*(ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                      (ulong)(uVar3 >> 3 & 0x3ff8)) >> ((ulong)uVar3 & 0x3f) & 1) != 0;
  }
  return false;
}

Assistant:

bool BloomFilter::exists(uint64_t key) const {
  unsigned int hash[4] = {0};
  MurmurHash3_x64_128(&key, sizeof(key), 1, &hash);
  return bits[hash[0] % (10240 * 8)] && bits[hash[1] % (10240 * 8)] &&
         bits[hash[2] % (10240 * 8)] && bits[hash[3] % (10240 * 8)];
}